

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

void HFSubWorker::distributionController(zsock_t *pipe,void *args)

{
  char *pcVar1;
  iterator iVar2;
  zsock_t *self;
  char *__s;
  zloop_t *self_00;
  _zactor_t **pp_Var3;
  vector<_zactor_t_*,_std::allocator<_zactor_t_*>_> *__range1;
  int iVar4;
  vector<_zactor_t_*,_std::allocator<_zactor_t_*>_> workers;
  zactor_t *worker;
  zloop_t *loop;
  _zactor_t **local_58;
  iterator iStack_50;
  _zactor_t **local_48;
  zactor_t *local_40;
  zloop_t *local_38;
  
  iVar4 = 0;
  zsock_signal(pipe,'\0');
  self = zsock_new_checked(8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                           ,0x184);
  *(zsock_t **)((long)args + 0xb8) = self;
  zsock_bind(self,"inproc://push_%p",args);
  __s = zsock_endpoint(*(zsock_t **)((long)args + 0xb8));
  pcVar1 = *(char **)((long)args + 200);
  strlen(__s);
  std::__cxx11::string::_M_replace((long)args + 0xc0,0,pcVar1,(ulong)__s);
  self_00 = zloop_new();
  local_38 = self_00;
  zloop_reader(self_00,pipe,HighFreqSub::pipeController,args);
  (**(code **)(*args + 0x20))(args,self_00);
  local_58 = (_zactor_t **)0x0;
  iStack_50._M_current = (_zactor_t **)0x0;
  local_48 = (_zactor_t **)0x0;
  if (0 < *(int *)((long)args + 0xb4)) {
    do {
      local_40 = zactor_new(workerthreadController,args);
      if (iStack_50._M_current == local_48) {
        std::vector<_zactor_t*,std::allocator<_zactor_t*>>::_M_realloc_insert<_zactor_t*const&>
                  ((vector<_zactor_t*,std::allocator<_zactor_t*>> *)&local_58,iStack_50,&local_40);
      }
      else {
        *iStack_50._M_current = local_40;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < *(int *)((long)args + 0xb4));
  }
  zloop_start(self_00);
  zsock_destroy_checked
            ((zsock_t **)((long)args + 0xb8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
             ,0x195);
  zloop_destroy(&local_38);
  iVar2._M_current = iStack_50._M_current;
  if (local_58 != iStack_50._M_current) {
    pp_Var3 = local_58;
    do {
      local_40 = *pp_Var3;
      zactor_destroy(&local_40);
      pp_Var3 = pp_Var3 + 1;
    } while (pp_Var3 != iVar2._M_current);
  }
  if (local_58 != (_zactor_t **)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

void HFSubWorker::distributionController(zsock_t *pipe, void *args){
    zsock_signal(pipe, 0);
    HFSubWorker *self = (HFSubWorker*)args;

    //Create push socket

    self->push = zsock_new(ZMQ_PUSH);
    zsock_bind(self->push, "inproc://push_%p", args);
    self->pullendpoint = zsock_endpoint(self->push);

    //Start loop controlling actor and sub sockets
    zloop_t *loop = zloop_new();
    zloop_reader(loop, pipe, pipeController, self);
    self->sub_reader(loop);

    //Start worker threads
    std::vector<zactor_t*> workers;
    for(int i = 0; i < self->nthreads; i++){
        zactor_t *worker = zactor_new(workerthreadController, self);
        workers.push_back(worker);
    }

    zloop_start(loop);
    zsock_destroy(&self->push);
    zloop_destroy(&loop);
    for(auto worker : workers){
        zactor_destroy(&worker);
    }
}